

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O0

void join(string *result,string *separator,vector<int,_std::allocator<int>_> *items)

{
  size_type sVar1;
  const_reference pvVar2;
  string local_1e0 [48];
  uint local_1b0;
  uint local_1ac;
  uint i;
  uint size;
  stringstream s;
  ostream local_198 [376];
  vector<int,_std::allocator<int>_> *local_20;
  vector<int,_std::allocator<int>_> *items_local;
  string *separator_local;
  string *result_local;
  
  local_20 = items;
  items_local = (vector<int,_std::allocator<int>_> *)separator;
  separator_local = result;
  std::__cxx11::stringstream::stringstream((stringstream *)&i);
  sVar1 = std::vector<int,_std::allocator<int>_>::size(local_20);
  local_1ac = (uint)sVar1;
  for (local_1b0 = 0; local_1b0 < local_1ac; local_1b0 = local_1b0 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_20,(ulong)local_1b0);
    std::ostream::operator<<(local_198,*pvVar2);
    if (local_1b0 < local_1ac - 1) {
      std::operator<<(local_198,(string *)items_local);
    }
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)separator_local,local_1e0);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&i);
  return;
}

Assistant:

void join (
  std::string& result,
  const std::string& separator,
  const std::vector<int>& items)
{
  std::stringstream s;
  unsigned int size = items.size ();
  for (unsigned int i = 0; i < size; ++i)
  {
    s << items[i];
    if (i < size - 1)
      s << separator;
  }

  result = s.str ();
}